

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerCloseWal(Pager *pPager,sqlite3 *db)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  int iVar3;
  int logexists;
  int local_1c;
  
  iVar2 = 0;
  if (pPager->pWal == (Wal *)0x0) {
    local_1c = 0;
    iVar2 = pagerLockDb(pPager,1);
    if (iVar2 == 0) {
      iVar2 = (*pPager->pVfs->xAccess)(pPager->pVfs,pPager->zWal,0,&local_1c);
    }
    if ((iVar2 == 0) && (local_1c != 0)) {
      iVar2 = pagerOpenWal(pPager);
    }
  }
  if (((iVar2 == 0) && (iVar2 = 0, pPager->pWal != (Wal *)0x0)) &&
     (iVar2 = pagerExclusiveLock(pPager), iVar2 == 0)) {
    iVar3 = sqlite3WalClose(pPager->pWal,db,(uint)pPager->walSyncFlags,pPager->pageSize,
                            (u8 *)pPager->pTmpSpace);
    pPager->pWal = (Wal *)0x0;
    pagerFixMaplimit(pPager);
    iVar2 = 0;
    if ((iVar3 != 0) && (iVar2 = iVar3, pPager->exclusiveMode == '\0')) {
      psVar1 = pPager->fd->pMethods;
      if (psVar1 != (sqlite3_io_methods *)0x0) {
        if (pPager->noLock == '\0') {
          (*psVar1->xUnlock)(pPager->fd,1);
        }
        if (pPager->eLock != '\x05') {
          pPager->eLock = '\x01';
        }
      }
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerCloseWal(Pager *pPager, sqlite3 *db){
  int rc = SQLITE_OK;

  assert( pPager->journalMode==PAGER_JOURNALMODE_WAL );

  /* If the log file is not already open, but does exist in the file-system,
  ** it may need to be checkpointed before the connection can switch to
  ** rollback mode. Open it now so this can happen.
  */
  if( !pPager->pWal ){
    int logexists = 0;
    rc = pagerLockDb(pPager, SHARED_LOCK);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsAccess(
          pPager->pVfs, pPager->zWal, SQLITE_ACCESS_EXISTS, &logexists
      );
    }
    if( rc==SQLITE_OK && logexists ){
      rc = pagerOpenWal(pPager);
    }
  }
    
  /* Checkpoint and close the log. Because an EXCLUSIVE lock is held on
  ** the database file, the log and log-summary files will be deleted.
  */
  if( rc==SQLITE_OK && pPager->pWal ){
    rc = pagerExclusiveLock(pPager);
    if( rc==SQLITE_OK ){
      rc = sqlite3WalClose(pPager->pWal, db, pPager->walSyncFlags,
                           pPager->pageSize, (u8*)pPager->pTmpSpace);
      pPager->pWal = 0;
      pagerFixMaplimit(pPager);
      if( rc && !pPager->exclusiveMode ) pagerUnlockDb(pPager, SHARED_LOCK);
    }
  }
  return rc;
}